

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O2

TIFFReadDirEntryErr TIFFReadDirEntryDoubleArray(TIFF *tif,TIFFDirEntry *direntry,double **value)

{
  uint16_t uVar1;
  ushort uVar2;
  uint uVar3;
  uint64_t uVar4;
  TIFFReadDirEntryErr TVar5;
  double *pdVar6;
  long lVar7;
  int64_t *ma;
  uint16_t *puVar8;
  uint32_t *puVar9;
  uint64_t *puVar10;
  uint32_t uVar11;
  double dVar12;
  uint32_t count;
  void *local_48;
  double **local_40;
  void *origdata;
  
  TVar5 = TIFFReadDirEntryErrType;
  if ((direntry->tdir_type < 0x12) && ((0x31f7aU >> (direntry->tdir_type & 0x1f) & 1) != 0)) {
    TVar5 = TIFFReadDirEntryArray(tif,direntry,&count,8,&origdata);
    if (origdata == (void *)0x0 || TVar5 != TIFFReadDirEntryErrOk) {
      *value = (double *)0x0;
    }
    else {
      if (direntry->tdir_type == 0xc) {
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabArrayOfLong8((uint64_t *)origdata,(ulong)count);
        }
        *value = (double *)origdata;
      }
      else {
        pdVar6 = (double *)_TIFFmallocExt(tif,(ulong)count * 8);
        if (pdVar6 == (double *)0x0) {
          _TIFFfreeExt(tif,origdata);
          return TIFFReadDirEntryErrAlloc;
        }
        local_48 = origdata;
        local_40 = value;
        switch(direntry->tdir_type) {
        case 1:
          for (lVar7 = 0; count != (uint32_t)lVar7; lVar7 = lVar7 + 1) {
            pdVar6[lVar7] = (double)*(byte *)((long)origdata + lVar7);
          }
          break;
        case 3:
          puVar8 = (uint16_t *)origdata;
          for (lVar7 = 0; count != (uint32_t)lVar7; lVar7 = lVar7 + 1) {
            if ((tif->tif_flags & 0x80) != 0) {
              TIFFSwabShort(puVar8);
            }
            uVar2 = *puVar8;
            puVar8 = puVar8 + 1;
            pdVar6[lVar7] = (double)uVar2;
          }
          break;
        case 4:
          puVar9 = (uint32_t *)origdata;
          for (lVar7 = 0; count != (uint32_t)lVar7; lVar7 = lVar7 + 1) {
            if ((tif->tif_flags & 0x80) != 0) {
              TIFFSwabLong(puVar9);
            }
            uVar3 = *puVar9;
            puVar9 = puVar9 + 1;
            pdVar6[lVar7] = (double)uVar3;
          }
          break;
        case 5:
          puVar9 = (uint32_t *)origdata;
          for (lVar7 = 0; origdata = local_48, count != (uint32_t)lVar7; lVar7 = lVar7 + 1) {
            if ((tif->tif_flags & 0x80) == 0) {
              uVar11 = *puVar9;
            }
            else {
              TIFFSwabLong(puVar9);
              uVar11 = *puVar9;
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong(puVar9 + 1);
              }
            }
            dVar12 = 0.0;
            if (puVar9[1] != 0) {
              dVar12 = (double)uVar11 / (double)puVar9[1];
            }
            puVar9 = puVar9 + 2;
            pdVar6[lVar7] = dVar12;
          }
          break;
        case 6:
          for (lVar7 = 0; count != (uint32_t)lVar7; lVar7 = lVar7 + 1) {
            pdVar6[lVar7] = (double)(int)*(char *)((long)origdata + lVar7);
          }
          break;
        case 8:
          puVar8 = (uint16_t *)origdata;
          for (lVar7 = 0; count != (uint32_t)lVar7; lVar7 = lVar7 + 1) {
            if ((tif->tif_flags & 0x80) != 0) {
              TIFFSwabShort(puVar8);
            }
            uVar1 = *puVar8;
            puVar8 = puVar8 + 1;
            pdVar6[lVar7] = (double)(int)(short)uVar1;
          }
          break;
        case 9:
          puVar9 = (uint32_t *)origdata;
          for (lVar7 = 0; count != (uint32_t)lVar7; lVar7 = lVar7 + 1) {
            if ((tif->tif_flags & 0x80) != 0) {
              TIFFSwabLong(puVar9);
            }
            uVar11 = *puVar9;
            puVar9 = puVar9 + 1;
            pdVar6[lVar7] = (double)(int)uVar11;
          }
          break;
        case 10:
          puVar9 = (uint32_t *)origdata;
          for (lVar7 = 0; origdata = local_48, count != (uint32_t)lVar7; lVar7 = lVar7 + 1) {
            if ((tif->tif_flags & 0x80) == 0) {
              uVar11 = *puVar9;
            }
            else {
              TIFFSwabLong(puVar9);
              uVar11 = *puVar9;
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong(puVar9 + 1);
              }
            }
            dVar12 = 0.0;
            if (puVar9[1] != 0) {
              dVar12 = (double)(int)uVar11 / (double)puVar9[1];
            }
            puVar9 = puVar9 + 2;
            pdVar6[lVar7] = dVar12;
          }
          break;
        case 0xb:
          if ((tif->tif_flags & 0x80) != 0) {
            TIFFSwabArrayOfLong((uint32_t *)origdata,(ulong)count);
          }
          for (lVar7 = 0; count != (uint32_t)lVar7; lVar7 = lVar7 + 1) {
            pdVar6[lVar7] = (double)*(float *)((long)origdata + lVar7 * 4);
          }
          break;
        case 0x10:
          puVar10 = (uint64_t *)origdata;
          for (lVar7 = 0; count != (uint32_t)lVar7; lVar7 = lVar7 + 1) {
            if ((tif->tif_flags & 0x80) != 0) {
              TIFFSwabLong8(puVar10);
            }
            uVar4 = *puVar10;
            puVar10 = puVar10 + 1;
            pdVar6[lVar7] =
                 ((double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
          }
          break;
        case 0x11:
          puVar10 = (uint64_t *)origdata;
          for (lVar7 = 0; count != (uint32_t)lVar7; lVar7 = lVar7 + 1) {
            if ((tif->tif_flags & 0x80) != 0) {
              TIFFSwabLong8(puVar10);
            }
            uVar4 = *puVar10;
            puVar10 = puVar10 + 1;
            pdVar6[lVar7] = (double)(long)uVar4;
          }
        }
        _TIFFfreeExt(tif,origdata);
        *local_40 = pdVar6;
      }
      TVar5 = TIFFReadDirEntryErrOk;
    }
  }
  return TVar5;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryDoubleArray(TIFF *tif, TIFFDirEntry *direntry, double **value)
{
    enum TIFFReadDirEntryErr err;
    uint32_t count;
    void *origdata;
    double *data;
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        case TIFF_SBYTE:
        case TIFF_SHORT:
        case TIFF_SSHORT:
        case TIFF_LONG:
        case TIFF_SLONG:
        case TIFF_LONG8:
        case TIFF_SLONG8:
        case TIFF_RATIONAL:
        case TIFF_SRATIONAL:
        case TIFF_FLOAT:
        case TIFF_DOUBLE:
            break;
        default:
            return (TIFFReadDirEntryErrType);
    }
    err = TIFFReadDirEntryArray(tif, direntry, &count, 8, &origdata);
    if ((err != TIFFReadDirEntryErrOk) || (origdata == 0))
    {
        *value = 0;
        return (err);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_DOUBLE:
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfLong8((uint64_t *)origdata, count);
            TIFFCvtIEEEDoubleToNative(tif, count, (double *)origdata);
            *value = (double *)origdata;
            return (TIFFReadDirEntryErrOk);
    }
    data = (double *)_TIFFmallocExt(tif, count * sizeof(double));
    if (data == 0)
    {
        _TIFFfreeExt(tif, origdata);
        return (TIFFReadDirEntryErrAlloc);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (double)(*ma++);
        }
        break;
        case TIFF_SBYTE:
        {
            int8_t *ma;
            double *mb;
            uint32_t n;
            ma = (int8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (double)(*ma++);
        }
        break;
        case TIFF_SHORT:
        {
            uint16_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint16_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort(ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_SSHORT:
        {
            int16_t *ma;
            double *mb;
            uint32_t n;
            ma = (int16_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort((uint16_t *)ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_LONG:
        {
            uint32_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_SLONG:
        {
            int32_t *ma;
            double *mb;
            uint32_t n;
            ma = (int32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong((uint32_t *)ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_LONG8:
        {
            uint64_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(ma);
#if defined(__WIN32__) && (_MSC_VER < 1500)
                /*
                 * XXX: MSVC 6.0 does not support
                 * conversion of 64-bit integers into
                 * floating point values.
                 */
                *mb++ = _TIFFUInt64ToDouble(*ma++);
#else
                *mb++ = (double)(*ma++);
#endif
            }
        }
        break;
        case TIFF_SLONG8:
        {
            int64_t *ma;
            double *mb;
            uint32_t n;
            ma = (int64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8((uint64_t *)ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_RATIONAL:
        {
            uint32_t *ma;
            uint32_t maa;
            uint32_t mab;
            double *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                maa = *ma++;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                mab = *ma++;
                if (mab == 0)
                    *mb++ = 0.0;
                else
                    *mb++ = (double)maa / (double)mab;
            }
        }
        break;
        case TIFF_SRATIONAL:
        {
            uint32_t *ma;
            int32_t maa;
            uint32_t mab;
            double *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                maa = *(int32_t *)ma;
                ma++;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                mab = *ma++;
                if (mab == 0)
                    *mb++ = 0.0;
                else
                    *mb++ = (double)maa / (double)mab;
            }
        }
        break;
        case TIFF_FLOAT:
        {
            float *ma;
            double *mb;
            uint32_t n;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfLong((uint32_t *)origdata, count);
            TIFFCvtIEEEFloatToNative(tif, count, (float *)origdata);
            ma = (float *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (double)(*ma++);
        }
        break;
    }
    _TIFFfreeExt(tif, origdata);
    *value = data;
    return (TIFFReadDirEntryErrOk);
}